

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_UpdateAvailableDeviceList(void)

{
  int iVar1;
  int iVar2;
  _func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *p_Var3;
  _func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *p_Var4;
  PaUtilHostApiRepresentation *pPVar5;
  PaError PVar6;
  PaError PVar7;
  uint uVar8;
  void **block;
  int *block_00;
  int iVar9;
  void **ppvVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  
  if (initializationCount_ == 0) {
    PVar6 = -10000;
  }
  else {
    block = (void **)PaUtil_AllocateMemory((long)hostApisCount_ << 3);
    PVar6 = -0x2708;
    if (block != (void **)0x0) {
      block_00 = (int *)PaUtil_AllocateMemory((long)hostApisCount_ << 2);
      uVar14 = 0;
      if (block_00 == (int *)0x0) {
        block_00 = (int *)0x0;
      }
      else {
        if (0 < hostApisCount_) {
          uVar14 = 0;
          ppvVar10 = block;
          piVar13 = block_00;
          do {
            p_Var3 = hostApis_[uVar14]->ScanDeviceInfos;
            if ((p_Var3 != (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr
                            *)0x0) &&
               (PVar6 = (*p_Var3)(hostApis_[uVar14],(PaHostApiIndex)uVar14,ppvVar10,piVar13),
               PVar6 != 0)) break;
            uVar14 = uVar14 + 1;
            piVar13 = piVar13 + 1;
            ppvVar10 = ppvVar10 + 1;
          } while ((long)uVar14 < (long)hostApisCount_);
        }
        if ((int)uVar14 < hostApisCount_) {
          if ((int)uVar14 != 0) {
            uVar11 = 0;
            do {
              p_Var4 = hostApis_[uVar11]->DisposeDeviceInfos;
              if (p_Var4 != (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0) {
                (*p_Var4)(hostApis_[uVar11],block[uVar11],block_00[uVar11]);
              }
              uVar11 = uVar11 + 1;
            } while ((uVar14 & 0xffffffff) != uVar11);
          }
          PVar6 = 0;
        }
        else {
          deviceCount_ = 0;
          if (hostApisCount_ < 1) {
            uVar8 = 0;
            PVar6 = 0;
          }
          else {
            lVar15 = 0;
            iVar12 = 0;
            PVar6 = 0;
            do {
              pPVar5 = hostApis_[lVar15];
              if (pPVar5->CommitDeviceInfos ==
                  (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0)
              {
                iVar9 = (pPVar5->info).deviceCount;
                uVar8 = 0xb;
LAB_0010b167:
                iVar12 = iVar12 + iVar9;
                deviceCount_ = deviceCount_ + iVar9;
              }
              else {
                PVar7 = (*pPVar5->CommitDeviceInfos)
                                  (pPVar5,(PaHostApiIndex)lVar15,block[lVar15],block_00[lVar15]);
                if (PVar7 == 0) {
                  iVar9 = (pPVar5->info).deviceCount;
                  iVar1 = (pPVar5->info).defaultInputDevice;
                  if (iVar9 <= iVar1) {
                    __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                                  ,0x34c,"PaError Pa_UpdateAvailableDeviceList(void)");
                  }
                  iVar2 = (pPVar5->info).defaultOutputDevice;
                  if (iVar9 <= iVar2) {
                    __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                                  ,0x34d,"PaError Pa_UpdateAvailableDeviceList(void)");
                  }
                  (pPVar5->privatePaFrontInfo).baseDeviceIndex = (long)iVar12;
                  if (iVar1 != -1) {
                    (pPVar5->info).defaultInputDevice = iVar1 + iVar12;
                  }
                  uVar8 = 0;
                  if (iVar2 != -1) {
                    (pPVar5->info).defaultOutputDevice = iVar2 + iVar12;
                  }
                  goto LAB_0010b167;
                }
                PVar6 = -0x2702;
                uVar8 = 2;
              }
              if ((uVar8 != 0xb) && (uVar8 != 0)) goto LAB_0010b194;
              lVar15 = lVar15 + 1;
            } while (lVar15 < hostApisCount_);
            uVar8 = 0;
          }
LAB_0010b194:
          if ((uVar8 & 0xd) != 0) {
            return PVar6;
          }
        }
      }
      goto LAB_0010b09d;
    }
  }
  block_00 = (int *)0x0;
  block = (void **)0x0;
LAB_0010b09d:
  if (block != (void **)0x0) {
    PaUtil_FreeMemory(block);
  }
  if (block_00 != (int *)0x0) {
    PaUtil_FreeMemory(block_00);
  }
  return PVar6;
}

Assistant:

PaError Pa_UpdateAvailableDeviceList( void )
{
    PaError result     = paNoError;
    void **scanResults = NULL;
    int  *deviceCounts = NULL;
    int i = 0;

    PA_LOGAPI_ENTER( "Pa_UpdateAvailableDeviceList" );
    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
        goto done;
    }

    /* Allocate data structures used in 2-stage commit */
    scanResults = (void **) PaUtil_AllocateMemory( sizeof(void*) * hostApisCount_ );
    if( !scanResults )
    {
        result = paInsufficientMemory;
        goto done;
    }

    deviceCounts = ( int * ) PaUtil_AllocateMemory( sizeof( int ) * hostApisCount_ );
    if( !deviceCounts )
    {
        result = paInsufficientMemory;
        goto done;
    }

    /* Phase 1: Perform a scan of new devices */
    for( i = 0 ; i < hostApisCount_ ; ++i )
    {
        PaUtilHostApiRepresentation *hostApi = hostApis_[i];
        PA_DEBUG(( "Scanning new device list for host api %d.\n",i));
        if( hostApi->ScanDeviceInfos == NULL )
            continue;

        if( hostApi->ScanDeviceInfos( hostApi, i, &scanResults[ i ], &deviceCounts[ i ] ) != paNoError )
            break;
    }

    /* Check the result of the scan operation */
    if( i < hostApisCount_ )
    {
        /* If failure, rollback the scan changes back to original state */
        int j = 0;
        for( j = 0 ; j < i ; ++j )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[j];
            if( hostApi->DisposeDeviceInfos == NULL )
                continue;

            PA_DEBUG(( "Performing rollback for device list scan for host api %d.\n",i));
            hostApi->DisposeDeviceInfos( hostApi, scanResults[ j ], deviceCounts[ j ] );
        }
    }
    else
    {
        int baseDeviceIndex = 0;
        deviceCount_ = 0;

        /* Otherwise, commit the scan changes to each back-end */
        for( i = 0 ; i < hostApisCount_ ; ++i )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[i];
            if( hostApi->CommitDeviceInfos == NULL )
            {
                /* Not yet implemented for this backend. Just
                   assume that the baseDeviceIndex and the paInternalInfo_.deviceCount_ are
                   incremented according to the values in the info */
                baseDeviceIndex += hostApi->info.deviceCount;
                deviceCount_ += hostApi->info.deviceCount;
                continue;
            }

            PA_DEBUG(( "Committing device list scan for host api %d.\n",i));
            if( hostApi->CommitDeviceInfos( hostApi, i, scanResults[ i ], deviceCounts[ i ] ) != paNoError )
            {
                PA_DEBUG(( "Committing failed (shouldn't happen) %d.\n",i));
                result = paInternalError;
                goto done;
            }

            assert( hostApi->info.defaultInputDevice < hostApi->info.deviceCount );
            assert( hostApi->info.defaultOutputDevice < hostApi->info.deviceCount );

            hostApi->privatePaFrontInfo.baseDeviceIndex = baseDeviceIndex;

            if( hostApi->info.defaultInputDevice != paNoDevice )
                hostApi->info.defaultInputDevice += baseDeviceIndex;

            if( hostApi->info.defaultOutputDevice != paNoDevice )
                hostApi->info.defaultOutputDevice += baseDeviceIndex;

            baseDeviceIndex += hostApi->info.deviceCount;
            deviceCount_ += hostApi->info.deviceCount;
        }
    }

done:

    if( scanResults )
        PaUtil_FreeMemory( scanResults );

    if( deviceCounts )
        PaUtil_FreeMemory( deviceCounts );

    return result;
}